

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

GLenum polyscope::render::backend_openGL3_glfw::native(ShaderStageType *x)

{
  runtime_error *this;
  undefined4 *in_RDI;
  GLenum local_4;
  
  switch(*in_RDI) {
  case 0:
    local_4 = 0x8b31;
    break;
  case 1:
    local_4 = 0x8e88;
    break;
  case 2:
    local_4 = 0x8e87;
    break;
  case 3:
    local_4 = 0x8dd9;
    break;
  case 4:
    local_4 = 0x8b30;
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"bad enum");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_4;
}

Assistant:

inline GLenum native(const ShaderStageType& x) {
  switch (x) {
    case ShaderStageType::Vertex:           return GL_VERTEX_SHADER;
    case ShaderStageType::Tessellation:     return GL_TESS_CONTROL_SHADER;
    case ShaderStageType::Evaluation:       return GL_TESS_EVALUATION_SHADER;
    case ShaderStageType::Geometry:         return GL_GEOMETRY_SHADER;
    //case ShaderStageType::Compute:          return GL_COMPUTE_SHADER;
    case ShaderStageType::Fragment:         return GL_FRAGMENT_SHADER;
  }
  throw std::runtime_error("bad enum");
}